

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFightingFactored.cpp
# Opt level: O1

void __thiscall
ProblemFireFightingFactored::ProblemFireFightingFactored
          (ProblemFireFightingFactored *this,size_t nrAgents,size_t nrHouses,size_t nrFLs,
          double costOfMove,bool forcePositionRepres,double multipleAgentExtinguishProb,
          bool initialize)

{
  undefined8 *puVar1;
  string local_a0;
  string local_80;
  double local_60;
  double local_58;
  string local_50;
  
  *(undefined8 *)&this->field_0x780 = 0x5b85c0;
  *(undefined8 *)&this->field_0x788 = 0x5b8928;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_60 = costOfMove;
  local_58 = multipleAgentExtinguishProb;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"temp-name","");
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"temp-description","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"none","");
  FactoredDecPOMDPDiscrete::FactoredDecPOMDPDiscrete
            (&this->super_FactoredDecPOMDPDiscrete,&PTR_construction_vtable_112__005b6c70,&local_80,
             &local_a0,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  *(undefined8 *)
   &(this->super_FactoredDecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscreteFactoredStates.
    super_MultiAgentDecisionProcess = 0x5b60e8;
  *(undefined8 *)&this->field_0x780 = 0x5b66e8;
  *(undefined8 *)&this->field_0x788 = 0x5b6a50;
  *(undefined8 *)
   &(this->super_FactoredDecPOMDPDiscrete).super_MultiAgentDecisionProcessDiscreteFactoredStates.
    field_0x600 = 0x5b64e8;
  *(size_t *)&(this->super_FactoredDecPOMDPDiscrete).field_0x708 = nrAgents;
  *(size_t *)&(this->super_FactoredDecPOMDPDiscrete).field_0x710 = nrHouses;
  this->_m_nrFireLevels = nrFLs;
  this->_m_costOfMove = local_60;
  this->_m_forcePositionRepres = forcePositionRepres;
  this->_m_multipleAgentExtinguishProb = local_58;
  (this->_m_nrPerStateFeatureVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_nrPerStateFeatureVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_nrPerStateFeatureVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_nrFLs_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_nrFLs_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_nrFLs_vec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((0.0 <= local_58) && (local_58 <= 1.0)) {
    if (initialize) {
      InitializePFFF(this);
    }
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar1 = &PTR__E_0059bd80;
  puVar1[1] = puVar1 + 3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(puVar1 + 1),
             "ProblemFireFightingFactored::ctor multipleAgentExtinguishProb should be >=0 and <=1",
             "");
  __cxa_throw(puVar1,&E::typeinfo,E::~E);
}

Assistant:

ProblemFireFightingFactored::ProblemFireFightingFactored(
        size_t nrAgents, size_t nrHouses, size_t nrFLs,
        double costOfMove, bool forcePositionRepres,
        double multipleAgentExtinguishProb, bool initialize)
    :
        FactoredDecPOMDPDiscrete(
                "temp-name",
                "temp-description",
                "none"),
        _m_nrAgents(nrAgents),
        _m_nrHouses(nrHouses),
        _m_nrFireLevels(nrFLs),
        _m_costOfMove(costOfMove),
        _m_forcePositionRepres(forcePositionRepres),
        _m_multipleAgentExtinguishProb(multipleAgentExtinguishProb)
{
    if(_m_multipleAgentExtinguishProb<0 ||
       _m_multipleAgentExtinguishProb>1)
           throw(E("ProblemFireFightingFactored::ctor multipleAgentExtinguishProb should be >=0 and <=1"));

    if(initialize)
        InitializePFFF();
}